

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O3

int __thiscall
unodb::detail::
basic_inode_16<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::init(basic_inode_16<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
       *this,EVP_PKEY_CTX *ctx)

{
  undefined1 uVar1;
  undefined1 auVar2 [16];
  int extraout_EAX;
  long in_RCX;
  long in_RDX;
  uint uVar3;
  ulong uVar4;
  ulong in_R8;
  ulong uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 local_18 [8];
  db_inode_reclaimable_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte>,_std::span<const_std::byte>_>_>
  reclaim_source_node;
  
  uVar1 = *(undefined1 *)(*(long *)(in_RCX + 8) + 0x20 + (in_R8 & 0xffffffff));
  local_18 = (undefined1  [8])ctx;
  if (*(char *)(in_RDX + 0x20) != '\x04') {
    __assert_fail("node_key_mask == (1U << this->children_count.load()) - 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x691,
                  "auto unodb::detail::basic_inode_4<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::get_insert_pos(std::uint8_t, unsigned int) const [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                 );
  }
  auVar7[1] = uVar1;
  auVar7[0] = uVar1;
  auVar7[2] = uVar1;
  auVar7[3] = uVar1;
  auVar7[4] = uVar1;
  auVar7[5] = uVar1;
  auVar7[6] = uVar1;
  auVar7[7] = uVar1;
  auVar7[8] = uVar1;
  auVar7[9] = uVar1;
  auVar7[10] = uVar1;
  auVar7[0xb] = uVar1;
  auVar7[0xc] = uVar1;
  auVar7[0xd] = uVar1;
  auVar7[0xe] = uVar1;
  auVar7[0xf] = uVar1;
  auVar2 = vpmaxub_avx(auVar7,ZEXT416(*(uint *)(in_RDX + 0x24)));
  auVar2 = vpcmpeqb_avx(auVar7,auVar2);
  uVar3 = (uint)(ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3);
  if (uVar3 == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = (ulong)(uint)POPCOUNT(uVar3);
    uVar5 = 0;
    do {
      *(undefined1 *)((long)((this->children)._M_elems + -2) + uVar5) =
           *(undefined1 *)(in_RDX + 0x24 + uVar5);
      (this->children)._M_elems[uVar5].value._M_i.tagged_ptr =
           *(uintptr_t *)(in_RDX + 0x28 + uVar5 * 8);
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  *(undefined1 *)((long)((this->children)._M_elems + -2) + uVar4) = uVar1;
  uVar5 = *(ulong *)(in_RCX + 8);
  *(undefined8 *)(in_RCX + 8) = 0;
  if ((uVar5 & 7) != 0) {
    __assert_fail("(result & ptr_bit_mask) == uintptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                  ,0x182,
                  "static std::uintptr_t unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>::tag_ptr(const Header *, unodb::node_type) [Header = unodb::detail::olc_node_header]"
                 );
  }
  (this->children)._M_elems[uVar4].value._M_i.tagged_ptr = uVar5;
  if ((uint)uVar4 < 4) {
    uVar5 = (ulong)((uint)uVar4 * 8);
    lVar6 = 0;
    do {
      *(undefined1 *)((long)(this->children)._M_elems + lVar6 + uVar4 + -0xf) =
           *(undefined1 *)(uVar4 + in_RDX + 0x24 + lVar6);
      *(undefined8 *)((long)&(this->children)._M_elems[lVar6 + 1].value._M_i.tagged_ptr + uVar5) =
           *(undefined8 *)(uVar5 + in_RDX + 0x28 + lVar6 * 8);
      lVar6 = lVar6 + 1;
    } while (4 - uVar4 != lVar6);
  }
  std::
  unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::db_inode_qsbr_deleter<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::db_inode_qsbr_deleter<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                 *)local_18);
  return extraout_EAX;
}

Assistant:

constexpr void init(db_type &db_instance, inode4_type &source_node,
                      db_leaf_unique_ptr child,
                      tree_depth_type depth) noexcept {
    const auto reclaim_source_node{
        ArtPolicy::template make_db_inode_reclaimable_ptr<inode4_type>(
            &source_node, db_instance)};
    const auto key_byte =
        static_cast<std::uint8_t>(child->get_key_view()[depth]);

#ifdef UNODB_DETAIL_X86_64
    const auto insert_pos_index = source_node.get_insert_pos(key_byte, 0xFU);
#else
    const auto keys_integer = source_node.keys.integer.load();
    const auto first_lt = ((keys_integer & 0xFFU) < key_byte) ? 1 : 0;
    const auto second_lt = (((keys_integer >> 8U) & 0xFFU) < key_byte) ? 1 : 0;
    const auto third_lt = (((keys_integer >> 16U) & 0xFFU) < key_byte) ? 1 : 0;
    const auto fourth_lt = (((keys_integer >> 24U) & 0xFFU) < key_byte) ? 1 : 0;
    const auto insert_pos_index =
        static_cast<unsigned>(first_lt + second_lt + third_lt + fourth_lt);
#endif

    unsigned i = 0;
    for (; i < insert_pos_index; ++i) {
      keys.byte_array[i] = source_node.keys.byte_array[i];
      children[i] = source_node.children[i];
    }

    UNODB_DETAIL_ASSUME(i < parent_class::capacity);

    keys.byte_array[i] = static_cast<std::byte>(key_byte);
    children[i] = node_ptr{child.release(), node_type::LEAF};
    ++i;

    for (; i <= inode4_type::capacity; ++i) {
      keys.byte_array[i] = source_node.keys.byte_array[i - 1];
      children[i] = source_node.children[i - 1];
    }
  }